

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void nullcPrintArrayVariableInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  int *ptr_00;
  int iVar1;
  char *pcVar2;
  ExternTypeInfo *pEVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  ExternTypeInfo *type_00;
  uint uVar7;
  
  pcVar2 = nullcDebugSymbols((uint *)0x0);
  pEVar3 = nullcDebugTypeInfo((uint *)0x0);
  uVar6 = (type->field_8).arrSize;
  if (uVar6 == 0xffffffff) {
    ptr_00 = *(int **)ptr;
    uVar6 = *(uint *)(ptr + 8);
    uVar7 = indentDepth;
    if (indentDepth != 0) {
      do {
        printf("  ");
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    printf("%s[] data = ",pcVar2 + pEVar3[(type->field_11).subType].offsetToName);
    pvVar4 = NULLC::GetBasePointer(ptr_00);
    if (pvVar4 == (void *)0x0) {
      printf("%p\n",ptr_00);
    }
    else {
      printf("%p [base %p, ",ptr_00,pvVar4);
      nullcPrintPointerMarkerInfo(*(markerType *)((long)pvVar4 + -8));
      puts("]");
    }
    uVar7 = indentDepth;
    if (indentDepth != 0) {
      do {
        printf("  ");
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    printf("len %u\n",(ulong)*(uint *)(ptr + 8));
    ptr = (char *)ptr_00;
  }
  if (type->pointerCount != 0) {
    uVar7 = 0x20;
    if (uVar6 < 0x20) {
      uVar7 = uVar6;
    }
    if (uVar6 != 0) {
      type_00 = pEVar3 + (type->field_11).subType;
      uVar6 = 0;
      do {
        uVar5 = indentDepth;
        if (indentDepth != 0) {
          do {
            printf("  ");
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        printf("[%u]",(ulong)uVar6);
        if ((type_00->subCat & ~CAT_POINTER) == CAT_NONE) {
          printf(" = ");
          nullcPrintBasicVariableInfo(type_00,ptr);
          putchar(10);
        }
        else {
          iVar1 = strcmp(pcVar2 + type_00->offsetToName,"typeid");
          if (iVar1 == 0) {
            printf(" = %s\n",pcVar2 + pEVar3[*(int *)ptr].offsetToName);
          }
          else {
            putchar(10);
            nullcPrintVariableInfo(type_00,ptr,indentDepth + 1);
          }
        }
        ptr = (char *)((long)ptr + (ulong)type_00->size);
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar7);
    }
  }
  return;
}

Assistant:

void nullcPrintArrayVariableInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);

	char *target = ptr;
	unsigned size = type.arrSize;

	if(type.arrSize == ~0u)
	{
		NULLCArray *arr = (NULLCArray*)ptr;

		target = arr->ptr;
		size = arr->len;

		nullcPrintDepthIndent(indentDepth);
		printf("%s[] data = ", codeSymbols + codeTypes[type.subType].offsetToName);

		if(void *base = NULLC::GetBasePointer(target))
		{
			markerType *marker = (markerType*)((char*)base - sizeof(markerType));

			printf("%p [base %p, ", target, base);
			nullcPrintPointerMarkerInfo(*marker);
			printf("]\n");
		}
		else
		{
			printf("%p\n", target);
		}

		nullcPrintDepthIndent(indentDepth);
		printf("len %u\n", arr->len);
	}

	if(type.pointerCount)
	{
		ExternTypeInfo &elementType = codeTypes[type.subType];

		for(unsigned i = 0; i < size && i < 32; i++)
		{
			nullcPrintDepthIndent(indentDepth);
			printf("[%u]", i);

			if(elementType.subCat == ExternTypeInfo::CAT_NONE || elementType.subCat == ExternTypeInfo::CAT_POINTER)
			{
				printf(" = ");
				nullcPrintBasicVariableInfo(elementType, target);
				printf("\n");
			}
			else if(strcmp(codeSymbols + elementType.offsetToName, "typeid") == 0)
			{
				printf(" = %s\n", codeSymbols + codeTypes[*(int*)(target)].offsetToName);
			}
			else
			{
				printf("\n");
				nullcPrintVariableInfo(elementType, target, indentDepth + 1);
			}

			target += elementType.size;
		}
	}
}